

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<kratos::EventControl> * __thiscall
pybind11::class_<kratos::EventControl>::def_readwrite<kratos::EventControl,kratos::EventEdgeType>
          (class_<kratos::EventControl> *this,char *name,
          offset_in_IRNode_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pm)

{
  return_value_policy local_5d [13];
  is_method local_50;
  handle local_48;
  cpp_function local_40;
  cpp_function fset;
  type local_30;
  cpp_function local_28;
  cpp_function fget;
  offset_in_IRNode_to_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pm_local;
  char *name_local;
  class_<kratos::EventControl> *this_local;
  
  local_30.pm = pm;
  fget.super_function.super_object.super_handle.m_ptr = (function)(function)pm;
  is_method::is_method((is_method *)&fset,(handle *)this);
  cpp_function::
  cpp_function<pybind11::class_<kratos::EventControl>::def_readwrite<kratos::EventControl,kratos::EventEdgeType>(char_const*,kratos::EventEdgeType_kratos::EventControl::*)::_lambda(kratos::EventControl_const&)_1_,pybind11::is_method,void>
            (&local_28,&local_30,(is_method *)&fset);
  local_48.m_ptr = (PyObject *)fget.super_function.super_object.super_handle.m_ptr;
  is_method::is_method(&local_50,(handle *)this);
  cpp_function::
  cpp_function<pybind11::class_<kratos::EventControl>::def_readwrite<kratos::EventControl,kratos::EventEdgeType>(char_const*,kratos::EventEdgeType_kratos::EventControl::*)::_lambda(kratos::EventControl&,kratos::EventEdgeType_const&)_1_,pybind11::is_method,void>
            (&local_40,(type *)&local_48,&local_50);
  local_5d[0] = reference_internal;
  def_property<pybind11::return_value_policy>(this,name,&local_28,&local_40,local_5d);
  cpp_function::~cpp_function(&local_40);
  cpp_function::~cpp_function(&local_28);
  return this;
}

Assistant:

class_ &def_readwrite(const char *name, D C::*pm, const Extra&... extra) {
        static_assert(std::is_same<C, type>::value || std::is_base_of<C, type>::value, "def_readwrite() requires a class member (or base class member)");
        cpp_function fget([pm](const type &c) -> const D &{ return c.*pm; }, is_method(*this)),
                     fset([pm](type &c, const D &value) { c.*pm = value; }, is_method(*this));
        def_property(name, fget, fset, return_value_policy::reference_internal, extra...);
        return *this;
    }